

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::parse_multipart_boundary(string *content_type,string *boundary)

{
  size_type sVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  string local_80 [32];
  string local_60 [32];
  long local_40;
  unsigned_long beg;
  size_type end;
  size_type pos;
  char *boundary_keyword;
  string *boundary_local;
  string *content_type_local;
  
  pos = (long)"multipart/byteranges; boundary=" + 0x16;
  boundary_keyword = (char *)boundary;
  boundary_local = content_type;
  end = std::__cxx11::string::find((char *)content_type,0x378a2d);
  if (end == 0xffffffffffffffff) {
    content_type_local._7_1_ = false;
  }
  else {
    beg = std::__cxx11::string::find((char)boundary_local,0x3b);
    sVar1 = end;
    sVar3 = strlen((char *)pos);
    local_40 = sVar1 + sVar3;
    std::__cxx11::string::substr((ulong)local_60,(ulong)boundary_local);
    std::__cxx11::string::operator=((string *)boundary_keyword,local_60);
    std::__cxx11::string::~string(local_60);
    uVar4 = std::__cxx11::string::length();
    if (1 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::front();
      if (*pcVar5 == '\"') {
        pcVar6 = (char *)std::__cxx11::string::back();
        pcVar5 = boundary_keyword;
        if (*pcVar6 == '\"') {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_80,(ulong)pcVar5);
          std::__cxx11::string::operator=((string *)boundary_keyword,local_80);
          std::__cxx11::string::~string(local_80);
        }
      }
    }
    bVar2 = std::__cxx11::string::empty();
    content_type_local._7_1_ = (bool)((bVar2 ^ 0xff) & 1);
  }
  return content_type_local._7_1_;
}

Assistant:

inline bool parse_multipart_boundary(const std::string &content_type,
                                     std::string &boundary) {
  auto boundary_keyword = "boundary=";
  auto pos = content_type.find(boundary_keyword);
  if (pos == std::string::npos) { return false; }
  auto end = content_type.find(';', pos);
  auto beg = pos + strlen(boundary_keyword);
  boundary = content_type.substr(beg, end - beg);
  if (boundary.length() >= 2 && boundary.front() == '"' &&
      boundary.back() == '"') {
    boundary = boundary.substr(1, boundary.size() - 2);
  }
  return !boundary.empty();
}